

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

void __thiscall cppcms::filters::datetime::datetime(datetime *this,streamable *t)

{
  streamable::streamable(&this->time_,t);
  (this->tz_)._M_dataplus._M_p = (pointer)&(this->tz_).field_2;
  (this->tz_)._M_string_length = 0;
  (this->tz_).field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

datetime::datetime(streamable const &t) : time_(t) {}